

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int GetHuffBitLengthsAndCodes(VP8LHistogramSet *histogram_image,HuffmanTreeCode *huffman_codes)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  VP8LHistogram *pVVar4;
  bool bVar5;
  ulong uVar6;
  void *ptr;
  uint8_t *buf_rle;
  HuffmanTree *huff_tree;
  void *pvVar7;
  HuffmanTreeCode *pHVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  HuffmanTreeCode *pHVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint64_t nmemb;
  ulong uVar16;
  
  uVar1 = histogram_image->size;
  uVar6 = 0;
  uVar16 = 0;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  iVar9 = 1;
  nmemb = 0;
  pHVar8 = huffman_codes;
LAB_00161dde:
  if (uVar6 == uVar16) {
    ptr = WebPSafeCalloc(nmemb,3);
    bVar5 = true;
    if (ptr == (void *)0x0) {
      buf_rle = (uint8_t *)0x0;
      huff_tree = (HuffmanTree *)0x0;
      iVar9 = 0;
    }
    else {
      uVar13 = 0;
      uVar6 = (ulong)(uVar1 * 5);
      if ((int)(uVar1 * 5) < 1) {
        uVar6 = uVar13;
      }
      pvVar7 = (void *)((long)ptr + nmemb * 2);
      uVar10 = 0;
      pvVar11 = ptr;
      for (; uVar6 * 0x18 - uVar13 != 0; uVar13 = uVar13 + 0x18) {
        uVar3 = *(uint *)((long)&huffman_codes->num_symbols + uVar13);
        *(void **)((long)&huffman_codes->codes + uVar13) = pvVar11;
        *(void **)((long)&huffman_codes->code_lengths + uVar13) = pvVar7;
        pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar3 * 2);
        pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar3);
        if ((int)uVar10 <= (int)uVar3) {
          uVar10 = uVar3;
        }
      }
      buf_rle = (uint8_t *)WebPSafeMalloc(1,(ulong)uVar10);
      huff_tree = (HuffmanTree *)WebPSafeMalloc((ulong)uVar10 * 3,0x10);
      if (huff_tree == (HuffmanTree *)0x0 || buf_rle == (uint8_t *)0x0) {
        iVar9 = 0;
      }
      else {
        pHVar8 = huffman_codes;
        for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
          pVVar4 = histogram_image->histograms[uVar6];
          VP8LCreateHuffmanTree(pVVar4->literal,0xf,buf_rle,huff_tree,pHVar8);
          VP8LCreateHuffmanTree(pVVar4->red,0xf,buf_rle,huff_tree,pHVar8 + 1);
          VP8LCreateHuffmanTree(pVVar4->blue,0xf,buf_rle,huff_tree,pHVar8 + 2);
          VP8LCreateHuffmanTree(pVVar4->alpha,0xf,buf_rle,huff_tree,pHVar8 + 3);
          VP8LCreateHuffmanTree(pVVar4->distance,0xf,buf_rle,huff_tree,pHVar8 + 4);
          pHVar8 = pHVar8 + 5;
        }
        bVar5 = false;
      }
    }
    WebPSafeFree(huff_tree);
    WebPSafeFree(buf_rle);
    if (bVar5) {
      WebPSafeFree(ptr);
      memset(huffman_codes,0,(long)(int)uVar1 * 0x78);
    }
    return iVar9;
  }
  pVVar4 = histogram_image->histograms[uVar6];
  lVar14 = 0;
  pHVar12 = pHVar8;
  do {
    if (lVar14 == 0) {
      iVar2 = pVVar4->palette_code_bits;
      iVar15 = (1 << ((byte)iVar2 & 0x1f)) + 0x118;
      if (iVar2 < 1) {
        iVar15 = 0x118;
      }
    }
    else {
      if (lVar14 == 5) break;
      iVar15 = 0x100;
      if (lVar14 == 4) {
        iVar15 = 0x28;
      }
    }
    pHVar12->num_symbols = iVar15;
    nmemb = nmemb + (long)iVar15;
    lVar14 = lVar14 + 1;
    pHVar12 = pHVar12 + 1;
  } while( true );
  uVar6 = uVar6 + 1;
  pHVar8 = pHVar8 + 5;
  goto LAB_00161dde;
}

Assistant:

static int GetHuffBitLengthsAndCodes(
    const VP8LHistogramSet* const histogram_image,
    HuffmanTreeCode* const huffman_codes) {
  int i, k;
  int ok = 0;
  uint64_t total_length_size = 0;
  uint8_t* mem_buf = NULL;
  const int histogram_image_size = histogram_image->size;
  int max_num_symbols = 0;
  uint8_t* buf_rle = NULL;
  HuffmanTree* huff_tree = NULL;

  // Iterate over all histograms and get the aggregate number of codes used.
  for (i = 0; i < histogram_image_size; ++i) {
    const VP8LHistogram* const histo = histogram_image->histograms[i];
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    assert(histo != NULL);
    for (k = 0; k < 5; ++k) {
      const int num_symbols =
          (k == 0) ? VP8LHistogramNumCodes(histo->palette_code_bits) :
          (k == 4) ? NUM_DISTANCE_CODES : 256;
      codes[k].num_symbols = num_symbols;
      total_length_size += num_symbols;
    }
  }

  // Allocate and Set Huffman codes.
  {
    uint16_t* codes;
    uint8_t* lengths;
    mem_buf = (uint8_t*)WebPSafeCalloc(total_length_size,
                                       sizeof(*lengths) + sizeof(*codes));
    if (mem_buf == NULL) goto End;

    codes = (uint16_t*)mem_buf;
    lengths = (uint8_t*)&codes[total_length_size];
    for (i = 0; i < 5 * histogram_image_size; ++i) {
      const int bit_length = huffman_codes[i].num_symbols;
      huffman_codes[i].codes = codes;
      huffman_codes[i].code_lengths = lengths;
      codes += bit_length;
      lengths += bit_length;
      if (max_num_symbols < bit_length) {
        max_num_symbols = bit_length;
      }
    }
  }

  buf_rle = (uint8_t*)WebPSafeMalloc(1ULL, max_num_symbols);
  huff_tree = (HuffmanTree*)WebPSafeMalloc(3ULL * max_num_symbols,
                                           sizeof(*huff_tree));
  if (buf_rle == NULL || huff_tree == NULL) goto End;

  // Create Huffman trees.
  for (i = 0; i < histogram_image_size; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    VP8LHistogram* const histo = histogram_image->histograms[i];
    VP8LCreateHuffmanTree(histo->literal, 15, buf_rle, huff_tree, codes + 0);
    VP8LCreateHuffmanTree(histo->red, 15, buf_rle, huff_tree, codes + 1);
    VP8LCreateHuffmanTree(histo->blue, 15, buf_rle, huff_tree, codes + 2);
    VP8LCreateHuffmanTree(histo->alpha, 15, buf_rle, huff_tree, codes + 3);
    VP8LCreateHuffmanTree(histo->distance, 15, buf_rle, huff_tree, codes + 4);
  }
  ok = 1;
 End:
  WebPSafeFree(huff_tree);
  WebPSafeFree(buf_rle);
  if (!ok) {
    WebPSafeFree(mem_buf);
    memset(huffman_codes, 0, 5 * histogram_image_size * sizeof(*huffman_codes));
  }
  return ok;
}